

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slots.cpp
# Opt level: O0

void __thiscall MainWindow::showHistory(MainWindow *this)

{
  QUndoView *pQVar1;
  PersistantDialog *pPVar2;
  QVBoxLayout *this_00;
  QUndoView *this_01;
  QUndoGroup *pQVar3;
  QString local_58;
  QFlags<Qt::AlignmentFlag> local_3c;
  QUndoView *local_38;
  QUndoView *undoView;
  QVBoxLayout *layout;
  QFlags<Qt::WindowType> local_18;
  Int local_14;
  MainWindow *local_10;
  MainWindow *this_local;
  
  local_10 = this;
  if (this->mHistoryDialog == (PersistantDialog *)0x0) {
    pPVar2 = (PersistantDialog *)operator_new(0x30);
    local_18 = Qt::operator|(WindowTitleHint,WindowSystemMenuHint);
    local_14 = (Int)QFlags<Qt::WindowType>::operator|(&local_18,WindowCloseButtonHint);
    PersistantDialog::PersistantDialog(pPVar2,(QWidget *)this,(WindowFlags)local_14);
    this->mHistoryDialog = pPVar2;
    this_00 = (QVBoxLayout *)operator_new(0x20);
    QVBoxLayout::QVBoxLayout(this_00);
    undoView = (QUndoView *)this_00;
    this_01 = (QUndoView *)operator_new(0x28);
    pQVar3 = Module::undoGroup(this->mModule);
    QUndoView::QUndoView(this_01,pQVar3,(QWidget *)0x0);
    pQVar1 = undoView;
    local_38 = this_01;
    QFlags<Qt::AlignmentFlag>::QFlags(&local_3c);
    QBoxLayout::addWidget((QWidget *)pQVar1,(int)this_01,(QFlags_conflict1 *)0x0);
    QWidget::setLayout((QLayout *)this->mHistoryDialog);
    pPVar2 = this->mHistoryDialog;
    tr(&local_58,"History",(char *)0x0,-1);
    QWidget::setWindowTitle((QString *)pPVar2);
    QString::~QString(&local_58);
  }
  QWidget::show();
  return;
}

Assistant:

void MainWindow::showHistory() {
    if (mHistoryDialog == nullptr) {
        mHistoryDialog = new PersistantDialog(this, Qt::WindowTitleHint | Qt::WindowSystemMenuHint | Qt::WindowCloseButtonHint);
        auto layout = new QVBoxLayout;
        auto undoView = new QUndoView(mModule->undoGroup());
        layout->addWidget(undoView);
        mHistoryDialog->setLayout(layout);
        mHistoryDialog->setWindowTitle(tr("History"));
    } 
    mHistoryDialog->show();
    
}